

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O3

void Omega_h::map_into<int>(Read<int> *a_data,LOs *a2b,Write<int> *b_data,Int width)

{
  long *plVar1;
  int iVar2;
  Alloc **ppAVar3;
  ulong uVar4;
  Alloc *pAVar5;
  LO n;
  size_t sVar6;
  ScopedTimer omega_h_scoped_function_timer;
  type f;
  string __str;
  ScopedTimer local_d1;
  Write<int> *local_d0;
  undefined1 local_c8 [24];
  Alloc *pAStack_b0;
  void *local_a8;
  Alloc *local_a0;
  void *local_98;
  Alloc **local_90;
  long local_88;
  Alloc *local_80;
  long lStack_78;
  Alloc **local_70;
  long local_68;
  Alloc *local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,"");
  local_d0 = b_data;
  plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
  ppAVar3 = (Alloc **)(plVar1 + 2);
  if ((Alloc **)*plVar1 == ppAVar3) {
    local_80 = *ppAVar3;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *ppAVar3;
    local_90 = (Alloc **)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)ppAVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x02');
  *(undefined2 *)local_70 = 0x3732;
  pAVar5 = (Alloc *)0xf;
  if (local_90 != &local_80) {
    pAVar5 = local_80;
  }
  if (pAVar5 < (Alloc *)(local_68 + local_88)) {
    pAVar5 = (Alloc *)0xf;
    if (local_70 != local_60) {
      pAVar5 = local_60[0];
    }
    if (pAVar5 < (Alloc *)(local_68 + local_88)) goto LAB_003005f4;
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_003005f4:
    plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
  }
  local_c8._0_8_ = local_c8 + 0x10;
  pAVar5 = (Alloc *)(plVar1 + 2);
  if ((Alloc *)*plVar1 == pAVar5) {
    local_c8._16_8_ = pAVar5->size;
    pAStack_b0 = (Alloc *)plVar1[3];
  }
  else {
    local_c8._16_8_ = pAVar5->size;
    local_c8._0_8_ = (Alloc *)*plVar1;
  }
  local_c8._8_8_ = plVar1[1];
  *plVar1 = (long)pAVar5;
  plVar1[1] = 0;
  *(undefined1 *)&pAVar5->size = 0;
  begin_code("map_into",(char *)local_c8._0_8_);
  if ((Alloc *)local_c8._0_8_ != (Alloc *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,(ulong)((long)&local_60[0]->size + 1));
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,(ulong)((long)&local_80->size + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pAVar5 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 1) == 0) {
    sVar6 = pAVar5->size;
  }
  else {
    sVar6 = (ulong)pAVar5 >> 3;
  }
  local_a0 = (a_data->write_).shared_alloc_.alloc;
  n = (LO)(sVar6 >> 2);
  if (((ulong)local_a0 & 1) == 0) {
    uVar4 = local_a0->size >> 2;
    iVar2 = n * width;
    if (iVar2 == (int)uVar4) goto LAB_0030072e;
  }
  else {
    iVar2 = (int)((ulong)local_a0 >> 5);
    if (n * width == iVar2) goto LAB_0030072e;
    uVar4 = (ulong)local_a0 >> 5 & 0xffffffff;
  }
  iVar2 = n * width;
  printf("ERROR: a_data.size= %d na= %d width= %d\n",uVar4,sVar6 >> 2 & 0xffffffff,
         (ulong)(uint)width);
  local_a0 = (a_data->write_).shared_alloc_.alloc;
LAB_0030072e:
  if (((ulong)local_a0 & 1) == 0) {
    uVar4 = local_a0->size;
  }
  else {
    uVar4 = (ulong)local_a0 >> 3;
  }
  if (iVar2 != (int)(uVar4 >> 2)) {
    fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
         ,0x1d);
  }
  local_c8._0_8_ = (a2b->write_).shared_alloc_.alloc;
  if ((local_c8._0_8_ & 7) == 0 && (Alloc *)local_c8._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8._0_8_ = ((Alloc *)local_c8._0_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_c8._0_8_)->use_count = ((Alloc *)local_c8._0_8_)->use_count + 1;
    }
  }
  local_c8._8_8_ = (a2b->write_).shared_alloc_.direct_ptr;
  local_c8._16_4_ = width;
  pAStack_b0 = (local_d0->shared_alloc_).alloc;
  if (((ulong)pAStack_b0 & 7) == 0 && pAStack_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAStack_b0 = (Alloc *)(pAStack_b0->size * 8 + 1);
    }
    else {
      pAStack_b0->use_count = pAStack_b0->use_count + 1;
    }
  }
  local_a8 = (local_d0->shared_alloc_).direct_ptr;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)(local_a0->size * 8 + 1);
    }
    else {
      local_a0->use_count = local_a0->use_count + 1;
    }
  }
  local_98 = (a_data->write_).shared_alloc_.direct_ptr;
  parallel_for<Omega_h::map_into<int>(Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Write<int>,int)::_lambda(int)_1_>
            (n,(type *)local_c8);
  map_into<int>(Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Write<int>,int)::{lambda(int)#1}::
  ~Write((_lambda_int__1_ *)local_c8);
  ScopedTimer::~ScopedTimer(&local_d1);
  return;
}

Assistant:

void map_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size();
  OMEGA_H_CHECK_PRINTF(a_data.size() == na * width, "a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    for (Int j = 0; j < width; ++j) {
      b_data[b * width + j] = a_data[a * width + j];
    }
  };
  parallel_for(na, std::move(f));
}